

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode post_per_transfer(GlobalConfig *global,per_transfer *per,CURLcode result,_Bool *retryp)

{
  OutStruct *outs;
  OperationConfig *config;
  CURL *curl;
  GlobalConfig *pGVar1;
  _Bool _Var2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  _Bool *p_Var7;
  char *pcVar8;
  char *pcVar9;
  FILE *pFVar10;
  FILE *pFVar11;
  timeval newer;
  long lStack_60;
  long oserrno;
  long cond_unmet;
  GlobalConfig *local_40;
  _Bool *local_38;
  
  config = per->config;
  curl = per->curl;
  if (config == (OperationConfig *)0x0 || curl == (CURL *)0x0) {
    return result;
  }
  *retryp = false;
  local_38 = retryp;
  if (per->infdopen == true) {
    close(per->infd);
  }
  outs = &per->outs;
  if ((result == CURLE_OK) || (config->synthetic_error != ERR_NONE)) {
    if (result == CURLE_OK) {
      if (((config->xattr == true) && ((per->outs).fopened == true)) &&
         (pFVar10 = (FILE *)(per->outs).stream, pFVar10 != (FILE *)0x0)) {
        iVar3 = fileno(pFVar10);
        iVar3 = fwrite_xattr(curl,iVar3);
        if (iVar3 != 0) {
          pGVar1 = config->global;
          piVar4 = __errno_location();
          pcVar8 = strerror(*piVar4);
          warnf(pGVar1,"Error setting extended attributes: %s\n",pcVar8);
        }
      }
      result = CURLE_OK;
      if (((per->outs).stream == (FILE *)0x0) && ((per->outs).bytes == 0)) {
        cond_unmet = 0;
        result = CURLE_OK;
        curl_easy_getinfo(curl,0x200023,&cond_unmet);
        if (cond_unmet == 0) {
          _Var2 = tool_create_output_file(outs,config);
          result = CURLE_OK;
          if (!_Var2) {
            result = CURLE_WRITE_ERROR;
          }
        }
      }
    }
  }
  else if (global->showerror != 0) {
    pFVar11 = global->errors;
    if (per->errorbuffer[0] == '\0') {
      pcVar8 = (char *)curl_easy_strerror(result);
    }
    else {
      pcVar8 = per->errorbuffer;
    }
    curl_mfprintf(pFVar11,"curl: (%d) %s\n",result,pcVar8);
    if (result == CURLE_PEER_FAILED_VERIFICATION) {
      fputs("More details here: https://curl.haxx.se/docs/sslcerts.html\n\ncurl failed to verify the legitimacy of the server and therefore could not\nestablish a secure connection to it. To learn more about this situation and\nhow to fix it, please visit the web page mentioned above.\n"
            ,(FILE *)global->errors);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  if ((((per->outs).s_isreg == false) &&
      (pFVar10 = (FILE *)(per->outs).stream, pFVar10 != (FILE *)0x0)) &&
     ((iVar3 = fflush(pFVar10), result == CURLE_OK && (iVar3 != 0)))) {
    curl_mfprintf(global->errors,"(%d) Failed writing body\n",0x17);
    result = CURLE_WRITE_ERROR;
  }
  if (((((per->outs).is_cd_filename == true) && ((per->outs).stream != (FILE *)0x0)) &&
      (global->mute == false)) && (outs->filename != (char *)0x0)) {
    curl_mprintf("curl: Saved to filename \'%s\'\n");
  }
  if (per->retry_numretries == 0) {
LAB_00114b08:
    if (per->metalink == true) {
      if (result == CURLE_OK) {
        oserrno = 0;
        curl_easy_getinfo(curl,0x100001,&oserrno);
        if (((oserrno == 0) || (iVar3 = curl_strnequal(oserrno,"http",4), iVar3 == 0)) ||
           ((curl_easy_getinfo(curl,0x200002,&cond_unmet), cond_unmet == 200 || (cond_unmet == 0xce)
            ))) goto LAB_00114b64;
        per->metalink_next_res = true;
        pFVar11 = global->errors;
        p_Var7 = (_Bool *)per->this_url;
        pcVar8 = per->mlfile->filename;
        pcVar9 = "Metalink: fetching (%s) from (%s) FAILED (HTTP status code %ld)\n";
        lVar5 = cond_unmet;
      }
      else {
        per->metalink_next_res = true;
        pFVar11 = global->errors;
        local_38 = (_Bool *)per->this_url;
        pcVar8 = per->mlfile->filename;
        local_40 = global;
        lVar5 = curl_easy_strerror(result);
        pcVar9 = "Metalink: fetching (%s) from (%s) FAILED (%s)\n";
        p_Var7 = local_38;
        global = local_40;
      }
      curl_mfprintf(pFVar11,pcVar9,pcVar8,p_Var7,lVar5);
    }
    goto LAB_00114b64;
  }
  if (config->retry_maxtime != 0) {
    newer = tvnow();
    lVar5 = tvdiff(newer,per->retrystart);
    if (SBORROW8(lVar5,config->retry_maxtime * 1000) == lVar5 + config->retry_maxtime * -1000 < 0)
    goto LAB_00114b08;
  }
  if ((result < CURLE_OBSOLETE29) &&
     ((0x10001060U >> (result & CURLE_FTP_COULDNT_USE_REST) & 1) != 0)) {
    lStack_60 = 1;
    local_40 = global;
LAB_001149f0:
    oserrno = 0;
    lVar5 = per->retry_sleep;
  }
  else {
    if ((result == CURLE_COULDNT_CONNECT) && (config->retry_connrefused != false)) {
      local_40 = global;
      curl_easy_getinfo(curl,0x200019,&oserrno);
      global = local_40;
      if (oserrno != 0x6f) goto LAB_00114b64;
      lStack_60 = 2;
      goto LAB_001149f0;
    }
    if ((result == CURLE_OK) ||
       ((result == CURLE_HTTP_RETURNED_ERROR && (config->failonerror != false)))) {
      lStack_60 = 0;
      local_40 = global;
      curl_easy_getinfo(curl,0x200030,&oserrno);
      if (oserrno - 1U < 2) {
        lStack_60 = 0;
        curl_easy_getinfo(curl,0x200002,&cond_unmet);
        if (((cond_unmet - 500U < 5) && (cond_unmet - 500U != 1)) || (cond_unmet == 0x1ad)) {
          lStack_60 = 3;
        }
      }
    }
    else {
      lStack_60 = 0;
      local_40 = global;
      curl_easy_getinfo(curl,0x200002,&cond_unmet);
      curl_easy_getinfo(curl,0x200030);
      if ((oserrno == 8) || (oserrno == 4)) {
        lStack_60 = (ulong)(cond_unmet - 400U < 100) << 2;
      }
    }
    global = local_40;
    if ((int)lStack_60 == 0) {
LAB_00114b64:
      if ((global->progressmode == 1) && ((per->progressbar).calls != 0)) {
        fputs("\n",(FILE *)(per->progressbar).out);
      }
      if (config->writeout != (char *)0x0) {
        ourWriteOut(per->curl,outs,config->writeout);
      }
      if (((((per->outs).fopened == true) &&
           (pFVar10 = (FILE *)(per->outs).stream, pFVar10 != (FILE *)0x0)) &&
          (iVar3 = fclose(pFVar10), result == CURLE_OK)) && (iVar3 != 0)) {
        curl_mfprintf(global->errors,"(%d) Failed writing body\n",0x17);
      }
      else if (((result == CURLE_OK) && (config->remote_time == true)) &&
              (((per->outs).s_isreg == true && (outs->filename != (char *)0x0)))) {
        cond_unmet = -1;
        curl_easy_getinfo(curl,0x60000e,&cond_unmet);
        setfiletime(cond_unmet,outs->filename,config->global->errors);
      }
      if (((per->heads).fopened == true) &&
         (pFVar10 = (FILE *)(per->heads).stream, pFVar10 != (FILE *)0x0)) {
        fclose(pFVar10);
      }
      if ((per->heads).alloc_filename == true) {
        free((per->heads).filename);
        (per->heads).filename = (char *)0x0;
      }
      if (((per->etag_save).fopened == true) &&
         (pFVar10 = (FILE *)(per->etag_save).stream, pFVar10 != (FILE *)0x0)) {
        fclose(pFVar10);
      }
      if ((per->etag_save).alloc_filename == true) {
        free((per->etag_save).filename);
        (per->etag_save).filename = (char *)0x0;
      }
      curl_easy_cleanup(per->curl);
      if ((per->outs).alloc_filename == true) {
        free(outs->filename);
      }
      free(per->this_url);
      free(per->separator_err);
      free(per->separator);
      free(per->outfile);
      free(per->uploadfile);
      return CURLE_OK;
    }
    oserrno = 0;
    lVar5 = per->retry_sleep;
    if ((int)lStack_60 == 3) {
      lStack_60 = 3;
      curl_easy_getinfo(curl,0x600039,&oserrno);
      if (oserrno != 0) {
        lVar5 = 0x7fffffffffffffff;
        if (oserrno < 0x20c49ba5e353f8) {
          lVar5 = oserrno * 1000;
        }
      }
    }
  }
  warnf(config->global,"Transient problem: %s Will retry in %ld seconds. %ld retries left.\n",
        post_per_transfer::m[lStack_60],lVar5 / 1000,per->retry_numretries);
  per->retry_numretries = per->retry_numretries + -1;
  tool_go_sleep(lVar5);
  p_Var7 = local_38;
  pGVar1 = local_40;
  if (config->retry_delay == 0) {
    lVar5 = per->retry_sleep;
    lVar6 = 600000;
    if (lVar5 < 0x493e1) {
      lVar6 = lVar5 * 2;
    }
    per->retry_sleep = lVar6;
  }
  if ((((per->outs).bytes != 0) && (outs->filename != (char *)0x0)) &&
     (pFVar10 = (FILE *)(per->outs).stream, pFVar10 != (FILE *)0x0)) {
    if (local_40->mute == false) {
      curl_mfprintf(local_40->errors,"Throwing away %ld bytes\n");
      pFVar10 = (FILE *)(per->outs).stream;
    }
    fflush(pFVar10);
    iVar3 = fileno((FILE *)(per->outs).stream);
    iVar3 = ftruncate64(iVar3,(per->outs).init);
    if (iVar3 == 0) {
      iVar3 = fseek((FILE *)(per->outs).stream,0,2);
      if (iVar3 == 0) {
        (per->outs).bytes = 0;
        goto LAB_00114e90;
      }
      if (pGVar1->mute != false) {
        return CURLE_WRITE_ERROR;
      }
      pFVar11 = pGVar1->errors;
      pcVar8 = "failed seeking to end of file, exiting\n";
    }
    else {
      if (pGVar1->mute != false) {
        return CURLE_WRITE_ERROR;
      }
      pFVar11 = pGVar1->errors;
      pcVar8 = "failed to truncate, exiting\n";
    }
    curl_mfprintf(pFVar11,pcVar8);
    return CURLE_WRITE_ERROR;
  }
LAB_00114e90:
  *p_Var7 = true;
  return CURLE_OK;
}

Assistant:

static CURLcode post_per_transfer(struct GlobalConfig *global,
                                  struct per_transfer *per,
                                  CURLcode result,
                                  bool *retryp)
{
  struct OutStruct *outs = &per->outs;
  CURL *curl = per->curl;
  struct OperationConfig *config = per->config;

  if(!curl || !config)
    return result;

  *retryp = FALSE;

  if(per->infdopen)
    close(per->infd);

#ifdef __VMS
  if(is_vms_shell()) {
    /* VMS DCL shell behavior */
    if(!global->showerror)
      vms_show = VMSSTS_HIDE;
  }
  else
#endif
    if(config->synthetic_error) {
      ;
    }
    else if(result && global->showerror) {
      fprintf(global->errors, "curl: (%d) %s\n", result,
              (per->errorbuffer[0]) ? per->errorbuffer :
              curl_easy_strerror(result));
      if(result == CURLE_PEER_FAILED_VERIFICATION)
        fputs(CURL_CA_CERT_ERRORMSG, global->errors);
    }

  /* Set file extended attributes */
  if(!result && config->xattr && outs->fopened && outs->stream) {
    int rc = fwrite_xattr(curl, fileno(outs->stream));
    if(rc)
      warnf(config->global, "Error setting extended attributes: %s\n",
            strerror(errno));
  }

  if(!result && !outs->stream && !outs->bytes) {
    /* we have received no data despite the transfer was successful
       ==> force cration of an empty output file (if an output file
       was specified) */
    long cond_unmet = 0L;
    /* do not create (or even overwrite) the file in case we get no
       data because of unmet condition */
    curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &cond_unmet);
    if(!cond_unmet && !tool_create_output_file(outs, config))
      result = CURLE_WRITE_ERROR;
  }

  if(!outs->s_isreg && outs->stream) {
    /* Dump standard stream buffered data */
    int rc = fflush(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      fprintf(global->errors, "(%d) Failed writing body\n", result);
    }
  }

#ifdef USE_METALINK
  if(per->metalink && !per->metalink_next_res)
    fprintf(global->errors, "Metalink: fetching (%s) from (%s) OK\n",
            per->mlfile->filename, per->this_url);

  if(!per->metalink && config->use_metalink && result == CURLE_OK) {
    int rv = parse_metalink(config, outs, per->this_url);
    if(!rv) {
      fprintf(config->global->errors, "Metalink: parsing (%s) OK\n",
              per->this_url);
    }
    else if(rv == -1)
      fprintf(config->global->errors, "Metalink: parsing (%s) FAILED\n",
              per->this_url);
  }
  else if(per->metalink && result == CURLE_OK && !per->metalink_next_res) {
    int rv;
    (void)fflush(outs->stream);
    rv = metalink_check_hash(global, per->mlfile, outs->filename);
    if(!rv)
      per->metalink_next_res = 1;
  }
#endif /* USE_METALINK */

#ifdef USE_METALINK
  if(outs->metalink_parser)
    metalink_parser_context_delete(outs->metalink_parser);
#endif /* USE_METALINK */

  if(outs->is_cd_filename && outs->stream && !global->mute &&
     outs->filename)
    printf("curl: Saved to filename '%s'\n", outs->filename);

  /* if retry-max-time is non-zero, make sure we haven't exceeded the
     time */
  if(per->retry_numretries &&
     (!config->retry_maxtime ||
      (tvdiff(tvnow(), per->retrystart) <
       config->retry_maxtime*1000L)) ) {
    enum {
      RETRY_NO,
      RETRY_TIMEOUT,
      RETRY_CONNREFUSED,
      RETRY_HTTP,
      RETRY_FTP,
      RETRY_LAST /* not used */
    } retry = RETRY_NO;
    long response;
    if((CURLE_OPERATION_TIMEDOUT == result) ||
       (CURLE_COULDNT_RESOLVE_HOST == result) ||
       (CURLE_COULDNT_RESOLVE_PROXY == result) ||
       (CURLE_FTP_ACCEPT_TIMEOUT == result))
      /* retry timeout always */
      retry = RETRY_TIMEOUT;
    else if(config->retry_connrefused &&
            (CURLE_COULDNT_CONNECT == result)) {
      long oserrno;
      curl_easy_getinfo(curl, CURLINFO_OS_ERRNO, &oserrno);
      if(ECONNREFUSED == oserrno)
        retry = RETRY_CONNREFUSED;
    }
    else if((CURLE_OK == result) ||
            (config->failonerror &&
             (CURLE_HTTP_RETURNED_ERROR == result))) {
      /* If it returned OK. _or_ failonerror was enabled and it
         returned due to such an error, check for HTTP transient
         errors to retry on. */
      long protocol;
      curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
      if((protocol == CURLPROTO_HTTP) || (protocol == CURLPROTO_HTTPS)) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);

        switch(response) {
        case 429: /* Too Many Requests (RFC6585) */
        case 500: /* Internal Server Error */
        case 502: /* Bad Gateway */
        case 503: /* Service Unavailable */
        case 504: /* Gateway Timeout */
          retry = RETRY_HTTP;
          /*
           * At this point, we have already written data to the output
           * file (or terminal). If we write to a file, we must rewind
           * or close/re-open the file so that the next attempt starts
           * over from the beginning.
           *
           * TODO: similar action for the upload case. We might need
           * to start over reading from a previous point if we have
           * uploaded something when this was returned.
           */
          break;
        }
      }
    } /* if CURLE_OK */
    else if(result) {
      long protocol;

      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
      curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);

      if((protocol == CURLPROTO_FTP || protocol == CURLPROTO_FTPS) &&
         response / 100 == 4)
        /*
         * This is typically when the FTP server only allows a certain
         * amount of users and we are not one of them.  All 4xx codes
         * are transient.
         */
        retry = RETRY_FTP;
    }

    if(retry) {
      long sleeptime = 0;
      curl_off_t retry_after = 0;
      static const char * const m[]={
        NULL,
        "timeout",
        "connection refused",
        "HTTP error",
        "FTP error"
      };

      sleeptime = per->retry_sleep;
      if(RETRY_HTTP == retry) {
        curl_easy_getinfo(curl, CURLINFO_RETRY_AFTER, &retry_after);
        if(retry_after) {
          /* store in a 'long', make sure it doesn't overflow */
          if(retry_after > LONG_MAX/1000)
            sleeptime = LONG_MAX;
          else
            sleeptime = (long)retry_after * 1000; /* milliseconds */
        }
      }
      warnf(config->global, "Transient problem: %s "
            "Will retry in %ld seconds. "
            "%ld retries left.\n",
            m[retry], sleeptime/1000L, per->retry_numretries);

      per->retry_numretries--;
      tool_go_sleep(sleeptime);
      if(!config->retry_delay) {
        per->retry_sleep *= 2;
        if(per->retry_sleep > RETRY_SLEEP_MAX)
          per->retry_sleep = RETRY_SLEEP_MAX;
      }
      if(outs->bytes && outs->filename && outs->stream) {
        int rc;
        /* We have written data to a output file, we truncate file
         */
        if(!global->mute)
          fprintf(global->errors, "Throwing away %"
                  CURL_FORMAT_CURL_OFF_T " bytes\n",
                  outs->bytes);
        fflush(outs->stream);
        /* truncate file at the position where we started appending */
#ifdef HAVE_FTRUNCATE
        if(ftruncate(fileno(outs->stream), outs->init)) {
          /* when truncate fails, we can't just append as then we'll
             create something strange, bail out */
          if(!global->mute)
            fprintf(global->errors,
                    "failed to truncate, exiting\n");
          return CURLE_WRITE_ERROR;
        }
        /* now seek to the end of the file, the position where we
           just truncated the file in a large file-safe way */
        rc = fseek(outs->stream, 0, SEEK_END);
#else
        /* ftruncate is not available, so just reposition the file
           to the location we would have truncated it. This won't
           work properly with large files on 32-bit systems, but
           most of those will have ftruncate. */
        rc = fseek(outs->stream, (long)outs->init, SEEK_SET);
#endif
        if(rc) {
          if(!global->mute)
            fprintf(global->errors,
                    "failed seeking to end of file, exiting\n");
          return CURLE_WRITE_ERROR;
        }
        outs->bytes = 0; /* clear for next round */
      }
      *retryp = TRUE; /* curl_easy_perform loop */
      return CURLE_OK;
    }
  } /* if retry_numretries */
  else if(per->metalink) {
    /* Metalink: Decide to try the next resource or not. Try the next resource
       if download was not successful. */
    long response;
    if(CURLE_OK == result) {
      /* TODO We want to try next resource when download was
         not successful. How to know that? */
      char *effective_url = NULL;
      curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &effective_url);
      if(effective_url &&
         curl_strnequal(effective_url, "http", 4)) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
        if(response != 200 && response != 206) {
          per->metalink_next_res = 1;
          fprintf(global->errors,
                  "Metalink: fetching (%s) from (%s) FAILED "
                  "(HTTP status code %ld)\n",
                  per->mlfile->filename, per->this_url, response);
        }
      }
    }
    else {
      per->metalink_next_res = 1;
      fprintf(global->errors,
              "Metalink: fetching (%s) from (%s) FAILED (%s)\n",
              per->mlfile->filename, per->this_url,
              curl_easy_strerror(result));
    }
  }

  if((global->progressmode == CURL_PROGRESS_BAR) &&
     per->progressbar.calls)
    /* if the custom progress bar has been displayed, we output a
       newline here */
    fputs("\n", per->progressbar.out);

  if(config->writeout)
    ourWriteOut(per->curl, &per->outs, config->writeout);

  /* Close the outs file */
  if(outs->fopened && outs->stream) {
    int rc = fclose(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      fprintf(global->errors, "(%d) Failed writing body\n", result);
    }
  }

  /* File time can only be set _after_ the file has been closed */
  if(!result && config->remote_time && outs->s_isreg && outs->filename) {
    /* Ask libcurl if we got a remote file time */
    curl_off_t filetime = -1;
    curl_easy_getinfo(curl, CURLINFO_FILETIME_T, &filetime);
    setfiletime(filetime, outs->filename, config->global->errors);
  }

  /* Close function-local opened file descriptors */
  if(per->heads.fopened && per->heads.stream)
    fclose(per->heads.stream);

  if(per->heads.alloc_filename)
    Curl_safefree(per->heads.filename);

  if(per->etag_save.fopened && per->etag_save.stream)
    fclose(per->etag_save.stream);

  if(per->etag_save.alloc_filename)
    Curl_safefree(per->etag_save.filename);

  curl_easy_cleanup(per->curl);
  if(outs->alloc_filename)
    free(outs->filename);
  free(per->this_url);
  free(per->separator_err);
  free(per->separator);
  free(per->outfile);
  free(per->uploadfile);

  return CURLE_OK;
}